

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void __thiscall
Fossilize::StateRecorder::init_recording_thread(StateRecorder *this,DatabaseInterface *iface)

{
  bool local_81;
  type local_80;
  thread local_60;
  void *local_58;
  void *userdata;
  LogCallback cb;
  _unnamed_type_1_ local_40;
  LogLevel level;
  bool local_38;
  bool local_37;
  DatabaseInterface *local_18;
  DatabaseInterface *iface_local;
  StateRecorder *this_local;
  
  this->impl->database_iface = iface;
  local_40 = (_unnamed_type_1_)0x1;
  level = LOG_ALL;
  local_38 = false;
  local_37 = true;
  local_18 = iface;
  iface_local = (DatabaseInterface *)this;
  memset((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffd0,0,0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffd0);
  Impl::anon_struct_40_5_2613688a_for_record_data::operator=
            (&this->impl->record_data,
             (anon_struct_40_5_2613688a_for_record_data *)&stack0xffffffffffffffc0);
  Impl::{unnamed_type#1}::~Impl(&stack0xffffffffffffffc0);
  local_81 = false;
  if (this->impl->module_identifier_database_iface != (DatabaseInterface *)0x0) {
    local_81 = this->impl->on_use_database_iface != (DatabaseInterface *)0x0;
  }
  this->impl->should_record_identifier_only = local_81;
  cb._4_4_ = get_thread_log_level();
  userdata = Internal::get_thread_log_callback();
  local_80.userdata = Internal::get_thread_log_userdata();
  local_80.level = cb._4_4_;
  local_80.cb = (LogCallback)userdata;
  local_80.this = this;
  local_58 = local_80.userdata;
  std::thread::
  thread<Fossilize::StateRecorder::init_recording_thread(Fossilize::DatabaseInterface*)::__0,,void>
            (&local_60,&local_80);
  std::thread::operator=(&this->impl->worker_thread,&local_60);
  std::thread::~thread(&local_60);
  return;
}

Assistant:

void StateRecorder::init_recording_thread(DatabaseInterface *iface)
{
	impl->database_iface = iface;
	impl->record_data = {};
	impl->should_record_identifier_only =
			impl->module_identifier_database_iface && impl->on_use_database_iface;

	auto level = get_thread_log_level();
	auto cb = Internal::get_thread_log_callback();
	auto userdata = Internal::get_thread_log_userdata();
	impl->worker_thread = std::thread([=]() {
		set_thread_log_level(level);
		set_thread_log_callback(cb, userdata);
		impl->record_task(this, true);
	});
}